

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

ExternFuncInfo * nullcFindModuleFunction(char *module,char *name,int index)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  ByteCode *code;
  ExternFuncInfo *pEVar6;
  uint uVar7;
  TraceScope traceScope;
  TraceScope local_40;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    pEVar6 = (ExternFuncInfo *)0x0;
  }
  else {
    if ((nullcFindModuleFunction(char_const*,char_const*,int)::token == '\0') &&
       (iVar4 = __cxa_guard_acquire(&nullcFindModuleFunction(char_const*,char_const*,int)::token),
       iVar4 != 0)) {
      nullcFindModuleFunction::token = NULLC::TraceGetToken("nullc","nullcFindModuleFunction");
      __cxa_guard_release(&nullcFindModuleFunction(char_const*,char_const*,int)::token);
    }
    NULLC::TraceScope::TraceScope(&local_40,nullcFindModuleFunction::token);
    lVar3 = NULLC::traceContext;
    sVar5 = strlen(module);
    uVar7 = (int)sVar5 + 1;
    if ((*(uint *)(lVar3 + 0x264) <= *(int *)(lVar3 + 0x260) + uVar7) ||
       (*(int *)(lVar3 + 0x270) == *(int *)(lVar3 + 0x274))) {
      NULLC::TraceDump();
    }
    if (*(uint *)(lVar3 + 0x264) <= uVar7) {
      __assert_fail("count < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x127,"void NULLC::TraceLabel(const char *)");
    }
    uVar1 = *(uint *)(lVar3 + 0x260);
    memcpy((void *)((ulong)uVar1 + *(long *)(lVar3 + 0x268)),module,(ulong)uVar7);
    *(int *)(lVar3 + 0x260) = *(int *)(lVar3 + 0x260) + uVar7;
    lVar2 = *(long *)(lVar3 + 0x278);
    uVar7 = *(uint *)(lVar3 + 0x270);
    *(uint *)(lVar3 + 0x270) = uVar7 + 1;
    *(uint *)(lVar2 + (ulong)uVar7 * 8) = uVar1 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (ulong)uVar7 * 8) = 0;
    code = (ByteCode *)BinaryCache::FindBytecode(module,true);
    if (code == (ByteCode *)0x0) {
      NULLC::nullcLastError = "ERROR: failed to find module";
    }
    else {
      uVar7 = NULLC::GetStringHash(name);
      pEVar6 = FindFirstFunc(code);
      for (iVar4 = code->functionCount - code->moduleFunctionCount; iVar4 != 0; iVar4 = iVar4 + -1)
      {
        if (uVar7 == pEVar6->nameHash) {
          if (index == 0) goto LAB_0021a217;
          index = index + -1;
        }
        pEVar6 = pEVar6 + 1;
      }
      NULLC::SafeSprintf(NULLC::errorBuf,0x10000,
                         "ERROR: function \'%s\' or one of it\'s overload is not found in module \'%s\'"
                         ,name,module);
      NULLC::nullcLastError = NULLC::errorBuf;
    }
    pEVar6 = (ExternFuncInfo *)0x0;
LAB_0021a217:
    NULLC::TraceScope::~TraceScope(&local_40);
  }
  return pEVar6;
}

Assistant:

ExternFuncInfo* nullcFindModuleFunction(const char* module, const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(NULL);

	TRACE_SCOPE("nullc", "nullcFindModuleFunction");
	TRACE_LABEL(module);

	const char *bytecode = BinaryCache::FindBytecode(module, true);

	// Create module if not found
	if(!bytecode)
	{
		nullcLastError = "ERROR: failed to find module";
		return NULL;
	}

	unsigned hash = NULLC::GetStringHash(name);
	ByteCode *code = (ByteCode*)bytecode;

	// Find function and set pointer
	ExternFuncInfo *fInfo = FindFirstFunc(code);

	unsigned end = code->functionCount - code->moduleFunctionCount;

	for(unsigned i = 0; i < end; i++, fInfo++)
	{
		if(hash != fInfo->nameHash)
			continue;

		if(index == 0)
			return fInfo;

		index--;
	}

	NULLC::SafeSprintf(errorBuf, NULLC_ERROR_BUFFER_SIZE, "ERROR: function '%s' or one of it's overload is not found in module '%s'", name, module);

	nullcLastError = errorBuf;
	return NULL;
}